

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  ImGuiTextBuffer *this;
  int iVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  int new_size;
  char *pcVar4;
  int old_size;
  
  pIVar3 = GImGui;
  this = &GImGui->DebugLogBuf;
  iVar1 = (GImGui->DebugLogBuf).Buf.Size;
  old_size = iVar1 + -1;
  if (iVar1 == 0) {
    old_size = 0;
  }
  ImGuiTextBuffer::appendf(this,"[%05d] ",(ulong)(uint)GImGui->FrameCount);
  ImGuiTextBuffer::appendfv(this,fmt,args);
  if ((pIVar3->DebugLogFlags & 0x400) != 0) {
    pcVar2 = (pIVar3->DebugLogBuf).Buf.Data;
    pcVar4 = ImGuiTextBuffer::EmptyString;
    if (pcVar2 != (char *)0x0) {
      pcVar4 = pcVar2;
    }
    printf("%s",pcVar4 + old_size);
  }
  pcVar2 = (pIVar3->DebugLogBuf).Buf.Data;
  pcVar4 = ImGuiTextBuffer::EmptyString;
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  iVar1 = (pIVar3->DebugLogBuf).Buf.Size;
  new_size = iVar1 + -1;
  if (iVar1 == 0) {
    new_size = 0;
  }
  ImGuiTextIndex::append(&pIVar3->DebugLogIndex,pcVar4,old_size,new_size);
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
    g.DebugLogIndex.append(g.DebugLogBuf.c_str(), old_size, g.DebugLogBuf.size());
}